

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_dump.cpp
# Opt level: O0

bool ApiDumpLayerWriteHtmlFooter(void)

{
  string local_230 [8];
  ofstream html_file;
  undefined1 local_20 [8];
  unique_lock<std::mutex> mlock;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&g_record_mutex);
  std::ofstream::ofstream(local_230);
  std::operator|(_S_out,_S_app);
  std::ofstream::open(local_230,0x38a298);
  std::operator<<((ostream *)local_230,"        </div>\n    </body>\n</html>");
  if ((g_record_info.initialized & 1U) != 0) {
    g_record_info.initialized = false;
    g_record_info.type = RECORD_NONE;
  }
  mlock._15_1_ = 1;
  std::ofstream::~ofstream(local_230);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return (bool)(mlock._15_1_ & 1);
}

Assistant:

bool ApiDumpLayerWriteHtmlFooter() {
    try {
        std::unique_lock<std::mutex> mlock(g_record_mutex);
        std::ofstream html_file;
        html_file.open(g_record_info.file_name, std::ios::out | std::ios::app);
        html_file << "        </div>\n"
                     "    </body>\n"
                     "</html>";

        // Writing the footer means we're done.
        if (g_record_info.initialized) {
            g_record_info.initialized = false;
            g_record_info.type = RECORD_NONE;
        }

        return true;
    } catch (...) {
        return false;
    }
}